

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O1

void cs_hmac_sha1(uchar *key,size_t keylen,uchar *data,size_t datalen,uchar *out)

{
  long lVar1;
  uchar tmp_key [20];
  uchar buf2 [64];
  uchar buf1 [64];
  cs_sha1_ctx ctx;
  uchar auStack_138 [32];
  byte local_118 [64];
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  cs_sha1_ctx local_8c;
  
  if (0x40 < keylen) {
    local_8c.state[0] = 0x67452301;
    local_8c.state[1] = 0xefcdab89;
    local_8c.state[2] = 0x98badcfe;
    local_8c.state[3] = 0x10325476;
    local_8c.state[4] = 0xc3d2e1f0;
    local_8c.count[0] = 0;
    local_8c.count[1] = 0;
    cs_sha1_update(&local_8c,key,(uint32_t)keylen);
    cs_sha1_final(auStack_138,&local_8c);
    keylen = 0x14;
    key = auStack_138;
  }
  local_a8 = 0;
  uStack_a0 = 0;
  local_b8 = 0;
  uStack_b0 = 0;
  local_c8 = 0;
  uStack_c0 = 0;
  local_d8 = 0;
  uStack_d0 = 0;
  local_118[0] = 0;
  local_118[1] = 0;
  local_118[2] = 0;
  local_118[3] = 0;
  local_118[4] = 0;
  local_118[5] = 0;
  local_118[6] = 0;
  local_118[7] = 0;
  local_118[8] = 0;
  local_118[9] = 0;
  local_118[10] = 0;
  local_118[0xb] = 0;
  local_118[0xc] = 0;
  local_118[0xd] = 0;
  local_118[0xe] = 0;
  local_118[0xf] = 0;
  local_118[0x10] = 0;
  local_118[0x11] = 0;
  local_118[0x12] = 0;
  local_118[0x13] = 0;
  local_118[0x14] = 0;
  local_118[0x15] = 0;
  local_118[0x16] = 0;
  local_118[0x17] = 0;
  local_118[0x18] = 0;
  local_118[0x19] = 0;
  local_118[0x1a] = 0;
  local_118[0x1b] = 0;
  local_118[0x1c] = 0;
  local_118[0x1d] = 0;
  local_118[0x1e] = 0;
  local_118[0x1f] = 0;
  local_118[0x20] = 0;
  local_118[0x21] = 0;
  local_118[0x22] = 0;
  local_118[0x23] = 0;
  local_118[0x24] = 0;
  local_118[0x25] = 0;
  local_118[0x26] = 0;
  local_118[0x27] = 0;
  local_118[0x28] = 0;
  local_118[0x29] = 0;
  local_118[0x2a] = 0;
  local_118[0x2b] = 0;
  local_118[0x2c] = 0;
  local_118[0x2d] = 0;
  local_118[0x2e] = 0;
  local_118[0x2f] = 0;
  local_118[0x30] = 0;
  local_118[0x31] = 0;
  local_118[0x32] = 0;
  local_118[0x33] = 0;
  local_118[0x34] = 0;
  local_118[0x35] = 0;
  local_118[0x36] = 0;
  local_118[0x37] = 0;
  local_118[0x38] = 0;
  local_118[0x39] = 0;
  local_118[0x3a] = 0;
  local_118[0x3b] = 0;
  local_118[0x3c] = 0;
  local_118[0x3d] = 0;
  local_118[0x3e] = 0;
  local_118[0x3f] = 0;
  memcpy(&local_d8,key,keylen);
  memcpy(local_118,key,keylen);
  lVar1 = 0;
  do {
    *(byte *)((long)&local_d8 + lVar1) = *(byte *)((long)&local_d8 + lVar1) ^ 0x36;
    local_118[lVar1] = local_118[lVar1] ^ 0x5c;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x40);
  local_8c.state[0] = 0x67452301;
  local_8c.state[1] = 0xefcdab89;
  local_8c.state[2] = 0x98badcfe;
  local_8c.state[3] = 0x10325476;
  local_8c.state[4] = 0xc3d2e1f0;
  local_8c.count[0] = 0;
  local_8c.count[1] = 0;
  cs_sha1_update(&local_8c,(uchar *)&local_d8,0x40);
  cs_sha1_update(&local_8c,data,(uint32_t)datalen);
  cs_sha1_final(out,&local_8c);
  local_8c.state[0] = 0x67452301;
  local_8c.state[1] = 0xefcdab89;
  local_8c.state[2] = 0x98badcfe;
  local_8c.state[3] = 0x10325476;
  local_8c.state[4] = 0xc3d2e1f0;
  local_8c.count[0] = 0;
  local_8c.count[1] = 0;
  cs_sha1_update(&local_8c,local_118,0x40);
  cs_sha1_update(&local_8c,out,0x14);
  cs_sha1_final(out,&local_8c);
  return;
}

Assistant:

void cs_hmac_sha1(const unsigned char *key, size_t keylen,
                  const unsigned char *data, size_t datalen,
                  unsigned char out[20]) {
    cs_sha1_ctx ctx;
    unsigned char buf1[64], buf2[64], tmp_key[20], i;

    if (keylen > sizeof(buf1)) {
        cs_sha1_init(&ctx);
        cs_sha1_update(&ctx, key, keylen);
        cs_sha1_final(tmp_key, &ctx);
        key = tmp_key;
        keylen = sizeof(tmp_key);
    }

    memset(buf1, 0, sizeof(buf1));
    memset(buf2, 0, sizeof(buf2));
    memcpy(buf1, key, keylen);
    memcpy(buf2, key, keylen);

    for (i = 0; i < sizeof(buf1); i++) {
        buf1[i] ^= 0x36;
        buf2[i] ^= 0x5c;
    }

    cs_sha1_init(&ctx);
    cs_sha1_update(&ctx, buf1, sizeof(buf1));
    cs_sha1_update(&ctx, data, datalen);
    cs_sha1_final(out, &ctx);

    cs_sha1_init(&ctx);
    cs_sha1_update(&ctx, buf2, sizeof(buf2));
    cs_sha1_update(&ctx, out, 20);
    cs_sha1_final(out, &ctx);
}